

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memstream.c
# Opt level: O0

ktx_error_code_e ktxMemStream_construct(ktxStream *str,ktx_bool_t freeOnDestruct)

{
  byte bVar1;
  byte in_SIL;
  ktxStream *in_RDI;
  ktx_error_code_e result;
  ktxMem *mem;
  FILE *local_20;
  undefined7 in_stack_ffffffffffffffe8;
  ktx_error_code_e local_4;
  
  bVar1 = in_SIL & 1;
  if (in_RDI == (ktxStream *)0x0) {
    local_4 = KTX_INVALID_VALUE;
  }
  else {
    local_4 = ktxMem_create((ktxMem **)
                            (CONCAT17(in_SIL,in_stack_ffffffffffffffe8) & 0x1ffffffffffffff));
    if (local_4 == KTX_SUCCESS) {
      (in_RDI->data).file = local_20;
      ktxMemStream_setup(in_RDI);
      in_RDI->closeOnDestruct = (ktx_bool_t)(bVar1 & 1);
    }
  }
  return local_4;
}

Assistant:

KTX_error_code ktxMemStream_construct(ktxStream* str,
                                      ktx_bool_t freeOnDestruct)
{
    ktxMem* mem;
    KTX_error_code result = KTX_SUCCESS;

    if (!str)
        return KTX_INVALID_VALUE;

    result = ktxMem_create(&mem);

    if (KTX_SUCCESS == result) {
        str->data.mem = mem;
        ktxMemStream_setup(str);
        str->closeOnDestruct = freeOnDestruct;
    }

    return result;
}